

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::Functional::FboRenderCase::iterate(FboRenderCase *this)

{
  int iVar1;
  Context *this_00;
  RenderContext *context_00;
  TestLog *log;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  RenderTarget *pRVar7;
  char *pcVar8;
  char *pcVar9;
  int height;
  bool bVar10;
  Surface refFrame;
  Surface gles2Frame;
  ReferenceContextBuffers buffers;
  deRandom rnd;
  GLContext context;
  Surface local_6390;
  Surface local_6378;
  PixelBufferAccess local_6360;
  ReferenceContextLimits local_6338;
  ReferenceContextBuffers local_62e0;
  deRandom local_6268;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  undefined1 local_61e0 [8];
  ContextType local_61d8;
  int local_61d4;
  ios_base local_6168 [24888];
  
  this_00 = (this->super_TestCase).m_context;
  context_00 = this_00->m_renderCtx;
  pRVar7 = Context::getRenderTarget(this_00);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_6268,dVar3);
  dVar3 = pRVar7->m_width;
  dVar6 = 0x80;
  if ((int)dVar3 < 0x80) {
    dVar6 = dVar3;
  }
  iVar1 = pRVar7->m_height;
  height = 0x80;
  if (iVar1 < 0x80) {
    height = iVar1;
  }
  dVar4 = deRandom_getUint32(&local_6268);
  dVar5 = deRandom_getUint32(&local_6268);
  tcu::Surface::Surface(&local_6378,dVar6,height);
  tcu::Surface::Surface(&local_6390,dVar6,height);
  local_62e0.m_colorbuffer.m_format.type = dVar5 % ((iVar1 - height) + 1U);
  local_62e0.m_colorbuffer.m_format.order = dVar4 % ((dVar3 - dVar6) + 1);
  local_62e0.m_colorbuffer.m_size.m_data[0] = dVar6;
  local_62e0.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext((GLContext *)local_61e0,context_00,log,1,(IVec4 *)&local_62e0);
  sglr::GLContext::clearColor((GLContext *)local_61e0,0.125,0.25,0.5,1.0);
  sglr::GLContext::clear((GLContext *)local_61e0,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,local_61e0,&local_6378);
  dVar3 = sglr::GLContext::getError((GLContext *)local_61e0);
  sglr::GLContext::~GLContext((GLContext *)local_61e0);
  local_61d4 = (uint)((pRVar7->m_pixelFormat).alphaBits != 0) << 3;
  local_61e0 = (undefined1  [8])0x800000008;
  local_61d8.super_ApiType.m_bits = (ApiType)8;
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_62e0,(PixelFormat *)local_61e0,pRVar7->m_depthBits,pRVar7->m_stencilBits,dVar6,
             height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6338,context_00);
  tcu::TextureLevel::getAccess(&local_6360,&local_62e0.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
  tcu::TextureLevel::getAccess(&local_6360,&local_62e0.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
  tcu::TextureLevel::getAccess(&local_6360,&local_62e0.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_61e0,&local_6338,&local_6208,&local_6230,&local_6258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6338.extensionStr._M_dataplus._M_p != &local_6338.extensionStr.field_2) {
    operator_delete(local_6338.extensionStr._M_dataplus._M_p,
                    local_6338.extensionStr.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&local_6338 + 0x20));
  sglr::ReferenceContext::clearColor((ReferenceContext *)local_61e0,0.125,0.25,0.5,1.0);
  sglr::ReferenceContext::clear((ReferenceContext *)local_61e0,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,local_61e0,&local_6390);
  dVar6 = sglr::ReferenceContext::getError((ReferenceContext *)local_61e0);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_61e0);
  tcu::TextureLevel::~TextureLevel(&local_62e0.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_62e0.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_62e0.m_colorbuffer);
  if (dVar3 == dVar6) {
    pcVar8 = (char *)0x0;
  }
  else {
    local_61e0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_61d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_61d8,"Error code mismatch: got ",0x19);
    local_62e0.m_colorbuffer.m_format = (TextureFormat)glu::getErrorName;
    local_62e0.m_colorbuffer.m_size.m_data[0] = dVar3;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_62e0,(ostream *)&local_61d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_61d8,", expected ",0xb);
    local_6338._0_8_ = glu::getErrorName;
    local_6338.maxTexture2DSize = dVar6;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_6338,(ostream *)&local_61d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_61e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_61d8);
    std::ios_base::~ios_base(local_6168);
    pcVar8 = "Got unexpected error";
  }
  bVar2 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&local_6390,&local_6378
                            ,0.03,COMPARE_LOG_RESULT);
  bVar10 = dVar3 != dVar6;
  pcVar9 = "Image comparison failed";
  if (bVar10) {
    pcVar9 = pcVar8;
  }
  if (bVar2) {
    pcVar9 = pcVar8;
  }
  pcVar8 = "Pass";
  if (bVar10 || !bVar2) {
    pcVar8 = pcVar9;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar10 || !bVar2)
             ,pcVar8);
  tcu::Surface::~Surface(&local_6390);
  tcu::Surface::~Surface(&local_6378);
  return STOP;
}

Assistant:

TestCase::IterateResult FboRenderCase::iterate (void)
{
	Vec4						clearColor				(0.125f, 0.25f, 0.5f, 1.0f);
	glu::RenderContext&			renderCtx				= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= m_context.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();
	const char*					failReason				= DE_NULL;

	// Position & size for context
	deRandom rnd;
	deRandom_init(&rnd, deStringHash(getName()));

	int		width	= deMin32(renderTarget.getWidth(), 128);
	int		height	= deMin32(renderTarget.getHeight(), 128);
	int		xMax	= renderTarget.getWidth()-width+1;
	int		yMax	= renderTarget.getHeight()-height+1;
	int		x		= deRandom_getUint32(&rnd) % xMax;
	int		y		= deRandom_getUint32(&rnd) % yMax;

	tcu::Surface	gles2Frame	(width, height);
	tcu::Surface	refFrame	(width, height);
	GLenum			gles2Error;
	GLenum			refError;

	// Render using GLES2
	try
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context, gles2Frame); // Call actual render func
		gles2Error = context.getError();
	}
	catch (const FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			// Mark test case as unsupported
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw; // Propagate error
	}

	// Render reference image
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context, refFrame);
		refError = context.getError();
	}

	// Compare error codes
	bool errorCodesOk = (gles2Error == refError);

	if (!errorCodesOk)
	{
		log << tcu::TestLog::Message << "Error code mismatch: got " << glu::getErrorStr(gles2Error) << ", expected " << glu::getErrorStr(refError) << tcu::TestLog::EndMessage;
		failReason = "Got unexpected error";
	}

	// Compare images
	const float		threshold	= 0.03f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodesOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}